

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.h
# Opt level: O2

void __thiscall SVGChart::PStyle::~PStyle(PStyle *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->mVar)._M_t);
  std::__cxx11::string::~string((string *)&this->mPenStyle);
  std::__cxx11::string::~string((string *)&this->mFont);
  return;
}

Assistant:

PStyle (): mFontSize(10), mPenWidth (1){}